

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Str_t * Gia_WritePacking(Vec_Int_t *vPacking)

{
  int iVar1;
  char *pArray;
  Vec_Str_t *pVVar2;
  int local_24;
  int nSize;
  int Entry;
  int i;
  uchar *pBuffer;
  Vec_Int_t *vPacking_local;
  
  iVar1 = Vec_IntSize(vPacking);
  pArray = (char *)malloc((long)(iVar1 << 2));
  local_24 = 0;
  for (nSize = 0; iVar1 = Vec_IntSize(vPacking), nSize < iVar1; nSize = nSize + 1) {
    iVar1 = Vec_IntEntry(vPacking,nSize);
    Gia_AigerWriteInt((uchar *)(pArray + (local_24 << 2)),iVar1);
    local_24 = local_24 + 1;
  }
  iVar1 = Vec_IntSize(vPacking);
  pVVar2 = Vec_StrAllocArray(pArray,iVar1 << 2);
  return pVVar2;
}

Assistant:

Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(vPacking) );
    int i, Entry, nSize = 0;
    Vec_IntForEachEntry( vPacking, Entry, i )
        Gia_AigerWriteInt( pBuffer + 4 * nSize++, Entry );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(vPacking) );
}